

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_afio.c
# Opt level: O0

void test_read_format_cpio_afio(void)

{
  int iVar1;
  char *file;
  archive *paVar2;
  archive *a;
  archive_entry *ae;
  size_t size;
  uchar *p;
  archive *in_stack_ffffffffffffffd8;
  archive *paVar3;
  char *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  char *file_00;
  wchar_t line;
  
  file_00 = buff3 + 0x37c410;
  file = (char *)malloc(0x1ab8000);
  assertion_assert(file_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (file != (char *)0x0) {
    memset(file,0,(size_t)file_00);
    memcpy(file,archive,0x160);
    paVar2 = archive_read_new();
    assertion_assert(file_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(char *)paVar2,
                     in_stack_ffffffffffffffd8);
    archive_read_support_filter_all(in_stack_ffffffffffffffd8);
    paVar3 = paVar2;
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x170cd5,ae);
    archive_read_support_format_all(paVar2);
    paVar2 = paVar3;
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar3
                        ,(longlong)paVar3,(char *)0x170d0e,ae);
    archive_read_open_memory(paVar2,paVar3,0x170d22);
    paVar3 = paVar2;
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x170d51,ae);
    archive_read_next_header(paVar3,(archive_entry **)paVar2);
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar3
                        ,(longlong)paVar3,(char *)0x170d8f,ae);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar3
                        ,0,(char *)0x170dca,ae);
    archive_entry_is_encrypted
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar3
                        ,0,(char *)0x170e03,ae);
    archive_read_has_encrypted_entries
              ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    paVar2 = paVar3;
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar3
                        ,(longlong)paVar3,(char *)0x170e3f,ae);
    archive_filter_code(paVar2,(int)((ulong)paVar3 >> 0x20));
    assertion_assert(file_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(char *)paVar2,
                     paVar3);
    archive_format(paVar2);
    assertion_assert(file_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(char *)paVar2,
                     paVar3);
    archive_read_next_header(paVar2,(archive_entry **)paVar3);
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x170ee5,ae);
    archive_entry_size((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar2
                        ,0,(char *)0x170f20,ae);
    iVar1 = uid_size();
    if (4 < iVar1) {
      archive_entry_uid((archive_entry *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (char *)paVar2,0,(char *)0x170f65,ae);
    }
    archive_entry_is_encrypted
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar2
                        ,0,(char *)0x170f9e,ae);
    archive_read_has_encrypted_entries
              ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    paVar3 = paVar2;
    assertion_equal_int(file,(wchar_t)((ulong)file_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x170fda,ae);
    archive_filter_code(paVar3,(int)((ulong)paVar2 >> 0x20));
    assertion_assert(file_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(char *)paVar3,
                     paVar2);
    archive_format(paVar3);
    assertion_assert(file_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(char *)paVar3,
                     paVar2);
    line = (wchar_t)((ulong)file_00 >> 0x20);
    archive_read_close((archive *)0x17104c);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)paVar3,0,(char *)0x17107a,ae);
    archive_read_free((archive *)0x171084);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)paVar3,0,(char *)0x1710b2,ae);
    free(file);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_afio)
{
	unsigned char *p;
	size_t size;
	struct archive_entry *ae;
	struct archive *a;

	/* The default block size of afio is 5120. we simulate it */
	size = (sizeof(archive) + 5120 -1 / 5120) * 5120;
	assert((p = malloc(size)) != NULL);
	if (p == NULL)
		return;
	memset(p, 0, size);
	memcpy(p, archive, sizeof(archive));
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, p, size));
	/*
	 * First entry is odc format.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(17, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertA(archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE);
	assertA(archive_format(a) == ARCHIVE_FORMAT_CPIO_POSIX);
	/*
	 * Second entry is afio large ASCII format.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(17, archive_entry_size(ae));
	if (uid_size() > 4)
		assertEqualInt(65536, archive_entry_uid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertA(archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE);
	assertA(archive_format(a) == ARCHIVE_FORMAT_CPIO_AFIO_LARGE);
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(p);
}